

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall
CfgNode::BlockData::addSignalHandler
          (BlockData *this,int sigid,CFG *handler,unsigned_long_long count)

{
  bool bVar1;
  pointer ppVar2;
  CFG *this_00;
  Addr AVar3;
  Addr AVar4;
  CfgSignalHandler *pCVar5;
  mapped_type *ppCVar6;
  CfgSignalHandler *cfgSignalHandler_1;
  CfgSignalHandler *cfgSignalHandler;
  _Rb_tree_const_iterator<std::pair<const_int,_CfgSignalHandler_*>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_int,_CfgSignalHandler_*>_> local_30;
  const_iterator it;
  unsigned_long_long count_local;
  CFG *handler_local;
  BlockData *pBStack_10;
  int sigid_local;
  BlockData *this_local;
  
  it._M_node = (_Base_ptr)count;
  handler_local._4_4_ = sigid;
  pBStack_10 = this;
  if (sigid < 0) {
    __assert_fail("sigid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                  ,0xb6,"void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)")
    ;
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
       ::find(&this->m_signalHandlers,(key_type_conflict *)((long)&handler_local + 4));
  std::_Rb_tree_const_iterator<std::pair<const_int,_CfgSignalHandler_*>_>::_Rb_tree_const_iterator
            (&local_30,&local_38);
  cfgSignalHandler =
       (CfgSignalHandler *)
       std::
       map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
       ::end(&this->m_signalHandlers);
  std::_Rb_tree_const_iterator<std::pair<const_int,_CfgSignalHandler_*>_>::_Rb_tree_const_iterator
            (&local_40,(iterator *)&cfgSignalHandler);
  bVar1 = std::operator!=(&local_30,&local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_CfgSignalHandler_*>_>::operator->
                       (&local_30);
    pCVar5 = ppVar2->second;
    this_00 = CfgSignalHandler::handler(pCVar5);
    AVar3 = CFG::addr(this_00);
    AVar4 = CFG::addr(handler);
    if (AVar3 != AVar4) {
      __assert_fail("cfgSignalHandler->handler()->addr() == handler->addr()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0xbb,
                    "void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)");
    }
    CfgSignalHandler::updateCount(pCVar5,(unsigned_long_long)it._M_node);
  }
  else {
    pCVar5 = (CfgSignalHandler *)operator_new(0x20);
    CfgSignalHandler::CfgSignalHandler
              (pCVar5,handler_local._4_4_,handler,(unsigned_long_long)it._M_node);
    ppCVar6 = std::
              map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
              ::operator[](&this->m_signalHandlers,(key_type_conflict *)((long)&handler_local + 4));
    *ppCVar6 = pCVar5;
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* handler, unsigned long long count) {
	assert(sigid >= 0);

	std::map<int, CfgSignalHandler*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		CfgSignalHandler* cfgSignalHandler = it->second;
		assert(cfgSignalHandler->handler()->addr() == handler->addr());
		cfgSignalHandler->updateCount(count);
	} else {
		CfgSignalHandler* cfgSignalHandler = new CfgSignalHandler(sigid, handler, count);
		m_signalHandlers[sigid] = cfgSignalHandler;
	}
}